

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cpp
# Opt level: O0

double __thiscall despot::Function::GetValue(Function *this,int pid,int cid)

{
  bool bVar1;
  size_type sVar2;
  const_reference this_00;
  const_reference pvVar3;
  const_reference pvVar4;
  pointer ppVar5;
  Function *local_40;
  _Self local_30;
  _Self local_28;
  const_iterator it;
  int cid_local;
  int pid_local;
  Function *this_local;
  
  it._M_node._0_4_ = cid;
  it._M_node._4_4_ = pid;
  sVar2 = std::
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ::size(&this->values_);
  if (sVar2 == 0) {
    pvVar4 = std::
             vector<std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>,_std::allocator<std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>_>_>
             ::operator[](&this->map_,(long)it._M_node._4_4_);
    local_28._M_node =
         (_Base_ptr)
         std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::find
                   (pvVar4,(key_type_conflict *)&it);
    pvVar4 = std::
             vector<std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>,_std::allocator<std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>_>_>
             ::operator[](&this->map_,(long)it._M_node._4_4_);
    local_30._M_node =
         (_Base_ptr)
         std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::end
                   (pvVar4);
    bVar1 = std::operator!=(&local_28,&local_30);
    if (bVar1) {
      ppVar5 = std::_Rb_tree_const_iterator<std::pair<const_int,_double>_>::operator->(&local_28);
      local_40 = (Function *)ppVar5->second;
    }
    else {
      local_40 = (Function *)0x0;
    }
    this_local = local_40;
  }
  else {
    this_00 = std::
              vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ::operator[](&this->values_,(long)it._M_node._4_4_);
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](this_00,(long)(int)it._M_node)
    ;
    this_local = (Function *)*pvVar3;
  }
  return (double)this_local;
}

Assistant:

double Function::GetValue(int pid, int cid) const {
	if (values_.size() > 0) { // TODO: possible refactoring to use a single data structure
		return values_[pid][cid];
	} else {
		map<int, double>::const_iterator it = map_[pid].find(cid);
		return it != map_[pid].end() ? it->second : 0;
	}
}